

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie_test.cpp
# Opt level: O0

void __thiscall unit_test::main(unit_test *this,string *param_2)

{
  bool bVar1;
  cookie *pcVar2;
  ostream *poVar3;
  ostream *poVar4;
  iterator cookie;
  cookies_type cookies;
  ostream *in_stack_fffffffffffffcd8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  *in_stack_fffffffffffffce0;
  int iVar5;
  string local_2c0 [32];
  string local_2a0 [32];
  _Self local_280;
  _Self local_278 [7];
  allocator local_239;
  string local_238 [39];
  allocator local_211;
  string local_210 [32];
  cookie local_1f0 [199];
  allocator local_129;
  string local_128 [55];
  allocator local_f1;
  string local_f0 [32];
  cookie local_d0 [208];
  
  pcVar2 = (cookie *)cppcms::application::response();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f0,"normal",&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_128,"token",&local_129);
  cppcms::http::cookie::cookie(local_d0,local_f0,local_128);
  cppcms::http::response::set_cookie(pcVar2);
  cppcms::http::cookie::~cookie(local_d0);
  std::__cxx11::string::~string(local_128);
  std::allocator<char>::~allocator((allocator<char> *)&local_129);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator((allocator<char> *)&local_f1);
  pcVar2 = (cookie *)cppcms::application::response();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_210,"utf",&local_211);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_238,anon_var_dwarf_3a0d,&local_239);
  cppcms::http::cookie::cookie(local_1f0,local_210,local_238);
  cppcms::http::response::set_cookie(pcVar2);
  cppcms::http::cookie::~cookie(local_1f0);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator((allocator<char> *)&local_239);
  std::__cxx11::string::~string(local_210);
  std::allocator<char>::~allocator((allocator<char> *)&local_211);
  cppcms::application::request();
  cppcms::http::request::cookies_abi_cxx11_();
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  ::map(in_stack_fffffffffffffce0,
        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
         *)in_stack_fffffffffffffcd8);
  local_278[0]._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
       ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
                *)in_stack_fffffffffffffcd8);
  while( true ) {
    local_280._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
                *)in_stack_fffffffffffffcd8);
    bVar1 = std::operator!=(local_278,&local_280);
    if (!bVar1) break;
    cppcms::application::response();
    poVar3 = (ostream *)cppcms::http::response::out();
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
                  *)0x10ca42);
    cppcms::http::cookie::name_abi_cxx11_();
    poVar3 = std::operator<<(poVar3,local_2a0);
    poVar4 = std::operator<<(poVar3,':');
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
                  *)0x10ca94);
    cppcms::http::cookie::value_abi_cxx11_();
    in_stack_fffffffffffffcd8 = std::operator<<(poVar4,local_2c0);
    iVar5 = (int)((ulong)poVar4 >> 0x20);
    std::operator<<(in_stack_fffffffffffffcd8,'\n');
    std::__cxx11::string::~string(local_2c0);
    std::__cxx11::string::~string(local_2a0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>
                  *)poVar3,iVar5);
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cppcms::http::cookie>_>_>
          *)0x10cc97);
  return;
}

Assistant:

virtual void main(std::string /*test*/)
	{
		response().set_cookie(cppcms::http::cookie("normal","token"));
		response().set_cookie(cppcms::http::cookie("utf","\xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D \xD7\xA9\xD7\x9C\xD7\x95\xD7\x9D"));
		typedef cppcms::http::request::cookies_type cookies_type;
		cookies_type cookies=request().cookies();
		for(cookies_type::iterator cookie=cookies.begin();cookie!=cookies.end();cookie++) {
			response().out()<<cookie->second.name()<<':'<<cookie->second.value()<<'\n';
		}
	}